

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void learn(nn_quant *nnq,int verbose)

{
  int iVar1;
  int iVar2;
  int g;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int r;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint rad;
  byte *pbVar10;
  int al;
  long lVar11;
  byte *pbVar12;
  int local_64;
  int local_60;
  ulong local_58;
  
  iVar9 = nnq->lengthcount;
  nnq->alphadec = (nnq->samplefac + -1) / 3 + 0x1e;
  pbVar10 = nnq->thepicture;
  lVar11 = (long)iVar9;
  uVar5 = (long)iVar9 / (long)(nnq->samplefac << 2);
  iVar6 = (int)uVar5;
  iVar1 = 0;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
    nnq->radpower[lVar4] = 0x40000U - iVar1 * (int)lVar4 & 0x7fc00;
    iVar1 = iVar1 + 0x100;
  }
  iVar1 = 1;
  if (0xc6 < iVar6 + 99U) {
    iVar1 = (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 100);
  }
  if (verbose != 0) {
    gd_error_ex(5,"beginning 1D learning: initial radius=%d\n",0x20);
    iVar9 = nnq->lengthcount;
  }
  uVar5 = (long)iVar9 % 499 & 0xffffffff;
  local_58 = 0x7cc;
  if ((int)((long)iVar9 % 499) == 0) {
    uVar5 = (long)iVar9 % 0x1eb & 0xffffffff;
    local_58 = 0x7ac;
    if ((int)((long)iVar9 % 0x1eb) == 0) {
      uVar5 = (long)iVar9 % 0x1e7 & 0xffffffff;
      local_58 = (ulong)((int)((long)iVar9 % 0x1e7) == 0) << 6 | 0x79c;
    }
  }
  pbVar12 = pbVar10 + lVar11;
  rad = 0x20;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  local_64 = 0x400;
  local_60 = 0x800;
  iVar9 = 0;
  while (iVar9 != iVar6) {
    al = (uint)*pbVar10 << 4;
    iVar3 = (uint)pbVar10[2] << 4;
    g = (uint)pbVar10[3] << 4;
    r = (uint)pbVar10[1] << 4;
    iVar2 = contest(nnq,al,iVar3,g,r);
    altersingle(nnq,local_64,iVar2,al,iVar3,g,r);
    if (rad != 0) {
      alterneigh(nnq,rad,iVar2,al,iVar3,g,r);
    }
    for (pbVar10 = pbVar10 + local_58; pbVar12 <= pbVar10;
        pbVar10 = pbVar10 + -(long)nnq->lengthcount) {
    }
    iVar9 = iVar9 + 1;
    uVar5 = (long)iVar9 % (long)iVar1 & 0xffffffff;
    if ((int)((long)iVar9 % (long)iVar1) == 0) {
      local_64 = local_64 - local_64 / nnq->alphadec;
      uVar5 = (long)local_60 % -0x1e;
      local_60 = local_60 + local_60 / -0x1e;
      rad = local_60 >> 6;
      if (local_60 >> 6 < 2) {
        rad = 0;
      }
      iVar3 = rad * rad;
      uVar7 = 0;
      if (0 < (int)rad) {
        uVar7 = (ulong)rad;
      }
      for (uVar8 = 0; uVar5 = uVar5 & 0xffffffff, uVar7 != uVar8; uVar8 = uVar8 + 1) {
        iVar2 = (iVar3 - (int)uVar8 * (int)uVar8) * 0x100;
        uVar5 = (long)iVar2 % (long)iVar3;
        nnq->radpower[uVar8] = (iVar2 / iVar3) * local_64;
      }
    }
  }
  if (verbose == 0) {
    return;
  }
  gd_error_ex(5,"finished 1D learning: final alpha=%f !\n",(double)((float)local_64 * 0.0009765625),
              uVar5);
  return;
}

Assistant:

void learn(nnq, verbose) /* Stu: N.B. added parameter so that main() could control verbosity. */
nn_quant *nnq;
int verbose;
{
	register int i,j,al,b,g,r;
	int radius,rad,alpha,step,delta,samplepixels;
	register unsigned char *p;
	unsigned char *lim;

	nnq->alphadec = 30 + ((nnq->samplefac-1)/3);
	p = nnq->thepicture;
	lim = nnq->thepicture + nnq->lengthcount;
	samplepixels = nnq->lengthcount/(4 * nnq->samplefac);
	/* here's a problem with small images: samplepixels < ncycles => delta = 0 */
	delta = samplepixels/ncycles;
	/* kludge to fix */
	if(delta==0) delta = 1;
	alpha = initalpha;
	radius = initradius;

	rad = radius >> radiusbiasshift;
	
	for (i=0; i<rad; i++)
		nnq->radpower[i] = alpha*(((rad*rad - i*i)*radbias)/(rad*rad));

	if (verbose) gd_error_ex(GD_NOTICE, "beginning 1D learning: initial radius=%d\n", rad);

	if ((nnq->lengthcount%prime1) != 0) step = 4*prime1;
	else {
		if ((nnq->lengthcount%prime2) !=0) step = 4*prime2;
		else {
			if ((nnq->lengthcount%prime3) !=0) step = 4*prime3;
			else step = 4*prime4;
		}
	}

	i = 0;
	while (i < samplepixels) {
		al = p[ALPHA] << netbiasshift;
		b = p[BLUE] << netbiasshift;
		g = p[GREEN] << netbiasshift;
		r = p[RED] << netbiasshift;
		j = contest(nnq, al,b,g,r);

		altersingle(nnq, alpha,j,al,b,g,r);
		if (rad) alterneigh(nnq, rad,j,al,b,g,r);   /* alter neighbours */

		p += step;
		while (p >= lim) p -= nnq->lengthcount;

		i++;
		if (i%delta == 0) {                    /* FPE here if delta=0*/
			alpha -= alpha / nnq->alphadec;
			radius -= radius / radiusdec;
			rad = radius >> radiusbiasshift;
			if (rad <= 1) rad = 0;
			for (j=0; j<rad; j++)
				nnq->radpower[j] = alpha*(((rad*rad - j*j)*radbias)/(rad*rad));
		}
	}
	if (verbose) gd_error_ex(GD_NOTICE, "finished 1D learning: final alpha=%f !\n",((float)alpha)/initalpha);
}